

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_ExecutePendingJob(JSRuntime *rt,JSContext **pctx)

{
  list_head *plVar1;
  list_head *plVar2;
  long lVar3;
  int iVar4;
  list_head *plVar5;
  JSContext *ctx;
  JSValue v;
  JSValue v_00;
  
  plVar1 = (rt->job_list).next;
  if (plVar1 == &rt->job_list) {
    ctx = (JSContext *)0x0;
    iVar4 = 0;
  }
  else {
    plVar5 = plVar1->prev;
    plVar2 = plVar1->next;
    plVar5->next = plVar2;
    plVar2->prev = plVar5;
    plVar1->prev = (list_head *)0x0;
    plVar1->next = (list_head *)0x0;
    ctx = (JSContext *)plVar1[1].prev;
    v_00 = (JSValue)(*(code *)plVar1[1].next)(ctx,*(undefined4 *)&plVar1[2].prev,&plVar1[2].next);
    plVar5 = plVar1 + 3;
    for (lVar3 = 0; lVar3 < *(int *)&plVar1[2].prev; lVar3 = lVar3 + 1) {
      v.tag = (int64_t)plVar5->prev;
      v.u = (JSValueUnion)(JSValueUnion)plVar5[-1].next;
      JS_FreeValue(ctx,v);
      plVar5 = plVar5 + 1;
    }
    iVar4 = (uint)((int)v_00.tag != 6) * 2 + -1;
    JS_FreeValue(ctx,v_00);
    (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,plVar1);
  }
  *pctx = ctx;
  return iVar4;
}

Assistant:

int JS_ExecutePendingJob(JSRuntime *rt, JSContext **pctx)
{
    JSContext *ctx;
    JSJobEntry *e;
    JSValue res;
    int i, ret;

    if (list_empty(&rt->job_list)) {
        *pctx = NULL;
        return 0;
    }

    /* get the first pending job and execute it */
    e = list_entry(rt->job_list.next, JSJobEntry, link);
    list_del(&e->link);
    ctx = e->ctx;
    res = e->job_func(e->ctx, e->argc, (JSValueConst *)e->argv);
    for(i = 0; i < e->argc; i++)
        JS_FreeValue(ctx, e->argv[i]);
    if (JS_IsException(res))
        ret = -1;
    else
        ret = 1;
    JS_FreeValue(ctx, res);
    js_free(ctx, e);
    *pctx = ctx;
    return ret;
}